

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  secp256k1_scalar *r2;
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  undefined4 extraout_EAX;
  long lVar8;
  secp256k1_ge *a;
  secp256k1_scalar *r1;
  long *plVar9;
  void *pvVar10;
  ulong uVar11;
  secp256k1_gej *r_00;
  int iVar12;
  secp256k1_gej *psVar13;
  secp256k1_scalar *psVar14;
  secp256k1_ge *psVar15;
  long lVar16;
  secp256k1_ge *psVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  size_t checkpoint;
  long lVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  size_t n_wnaf;
  secp256k1_scalar tmp;
  size_t local_138;
  long local_130;
  secp256k1_gej local_c8;
  
  bVar23 = 0;
  lVar8 = 0;
  do {
    iVar12 = (uint)scratch->magic[lVar8] - (uint)(byte)"scratch"[lVar8];
    if (scratch->magic[lVar8] != "scratch"[lVar8]) goto LAB_001503a4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  iVar12 = 0;
LAB_001503a4:
  if (iVar12 == 0) {
    checkpoint = scratch->alloc_size;
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    checkpoint = 0;
  }
  secp256k1_gej_set_infinity(r);
  iVar12 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar8 = n_points * 2 + 2;
    local_138 = n_points;
    uVar7 = secp256k1_pippenger_bucket_window(n_points);
    a = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar8 * 0x68);
    r1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar8 * 0x20);
    plVar9 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar9 == (long *)0x0 || r1 == (secp256k1_scalar *)0x0) || a == (secp256k1_ge *)0x0) {
LAB_00150467:
      iVar12 = 0;
    }
    else {
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar8 * 0x10);
      plVar9[1] = (long)pvVar10;
      iVar12 = 0;
      uVar11 = (ulong)((int)(0x7f / (ulong)(uVar7 + 1)) + 1);
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar8 * uVar11 * 4);
      *plVar9 = (long)pvVar10;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x98L << ((byte)uVar7 & 0x3f));
      if ((plVar9[1] != 0) && (iVar12 = 0, r_00 != (secp256k1_gej *)0x0 && *plVar9 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar8 = 0;
        }
        else {
          uVar4 = inp_g_sc->d[0];
          uVar5 = inp_g_sc->d[1];
          uVar6 = inp_g_sc->d[3];
          r1->d[2] = inp_g_sc->d[2];
          r1->d[3] = uVar6;
          r1->d[0] = uVar4;
          r1->d[1] = uVar5;
          psVar15 = &secp256k1_ge_const_g;
          psVar17 = a;
          for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
            (psVar17->x).n[0] = (psVar15->x).n[0];
            psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar23 * -2 + 1) * 8);
            psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8);
          }
          psVar14 = r1 + 1;
          psVar15 = a + 1;
          local_c8.x.n[0] = r1->d[0];
          local_c8.x.n[1] = r1->d[1];
          local_c8.x.n[2] = r1->d[2];
          local_c8.x.n[3] = r1->d[3];
          secp256k1_scalar_split_lambda(r1,psVar14,(secp256k1_scalar *)&local_c8);
          secp256k1_ge_mul_lambda(psVar15,a);
          iVar12 = secp256k1_scalar_is_high(r1);
          if (iVar12 != 0) {
            secp256k1_scalar_negate(r1,r1);
            secp256k1_ge_neg(a,a);
          }
          iVar12 = secp256k1_scalar_is_high(psVar14);
          if (iVar12 != 0) {
            secp256k1_scalar_negate(psVar14,psVar14);
            secp256k1_ge_neg(psVar15,psVar15);
          }
          lVar8 = 2;
        }
        if (n_points != 0) {
          psVar14 = (secp256k1_scalar *)((long)r1->d + (ulong)(uint)((int)lVar8 << 5));
          psVar15 = a + lVar8;
          do {
            iVar12 = (*cb)(psVar14,psVar15,cb_offset,cbdata);
            if (iVar12 == 0) goto LAB_00150467;
            r2 = psVar14 + 1;
            psVar17 = psVar15 + 1;
            local_c8.x.n[0] = psVar14->d[0];
            local_c8.x.n[1] = psVar14->d[1];
            local_c8.x.n[2] = psVar14->d[2];
            local_c8.x.n[3] = psVar14->d[3];
            secp256k1_scalar_split_lambda(psVar14,r2,(secp256k1_scalar *)&local_c8);
            secp256k1_ge_mul_lambda(psVar17,psVar15);
            iVar12 = secp256k1_scalar_is_high(psVar14);
            if (iVar12 != 0) {
              secp256k1_scalar_negate(psVar14,psVar14);
              secp256k1_ge_neg(psVar15,psVar15);
            }
            iVar12 = secp256k1_scalar_is_high(r2);
            if (iVar12 != 0) {
              secp256k1_scalar_negate(r2,r2);
              secp256k1_ge_neg(psVar17,psVar17);
            }
            lVar8 = lVar8 + 2;
            cb_offset = cb_offset + 1;
            psVar14 = psVar14 + 2;
            psVar15 = psVar15 + 2;
            local_138 = local_138 - 1;
          } while (local_138 != 0);
        }
        if (lVar8 == 0) {
          local_138 = 0;
        }
        else {
          lVar22 = 0;
          local_138 = 0;
          psVar15 = a;
          do {
            secp256k1_scalar_verify(r1);
            auVar24._0_4_ = -(uint)((int)r1->d[2] == 0 && (int)r1->d[0] == 0);
            auVar24._4_4_ =
                 -(uint)(*(int *)((long)r1->d + 0x14) == 0 && *(int *)((long)r1->d + 4) == 0);
            auVar24._8_4_ = -(uint)((int)r1->d[3] == 0 && (int)r1->d[1] == 0);
            auVar24._12_4_ =
                 -(uint)(*(int *)((long)r1->d + 0x1c) == 0 && *(int *)((long)r1->d + 0xc) == 0);
            iVar12 = movmskps(extraout_EAX,auVar24);
            if ((iVar12 != 0xf) && (secp256k1_ge_verify(psVar15), psVar15->infinity == 0)) {
              *(long *)(plVar9[1] + 8 + local_138 * 0x10) = lVar22;
              iVar12 = secp256k1_wnaf_fixed((int *)(local_138 * uVar11 * 4 + *plVar9),r1,uVar7 + 1);
              *(int *)(plVar9[1] + local_138 * 0x10) = iVar12;
              local_138 = local_138 + 1;
            }
            lVar22 = lVar22 + 1;
            psVar15 = psVar15 + 1;
            r1 = r1 + 1;
          } while (lVar8 != lVar22);
        }
        secp256k1_gej_set_infinity(r);
        iVar12 = 1;
        if (local_138 != 0) {
          lVar16 = 1L << ((byte)uVar7 & 0x3f);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (ulong)uVar7 + 1;
          auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
          uVar19 = (ulong)(uint)(auVar3._0_4_ << 2);
          lVar8 = uVar19 + 4;
          uVar11 = (ulong)((int)lVar16 - 2);
          psVar13 = r_00;
          lVar22 = lVar16;
          local_130 = auVar3._0_8_;
          do {
            do {
              secp256k1_gej_set_infinity(psVar13);
              lVar22 = lVar22 + -1;
              psVar13 = psVar13 + 1;
            } while (lVar22 != 0);
            lVar22 = 8;
            uVar18 = uVar19;
            sVar20 = local_138;
            do {
              uVar21 = *(uint *)(*plVar9 + uVar18);
              lVar1 = *(long *)(plVar9[1] + lVar22);
              if ((local_130 == 0) && (*(int *)(plVar9[1] + -8 + lVar22) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)&local_c8,a + lVar1);
                secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)&local_c8,(secp256k1_fe *)0x0);
              }
              if ((int)uVar21 < 1) {
                if ((int)uVar21 < 0) {
                  uVar21 = ~uVar21;
                  secp256k1_ge_neg((secp256k1_ge *)&local_c8,a + lVar1);
                  psVar13 = &local_c8;
                  goto LAB_001508a7;
                }
              }
              else {
                uVar21 = uVar21 - 1;
                psVar13 = (secp256k1_gej *)(a + lVar1);
LAB_001508a7:
                secp256k1_gej_add_ge_var
                          (r_00 + (uVar21 >> 1),r_00 + (uVar21 >> 1),(secp256k1_ge *)psVar13,
                           (secp256k1_fe *)0x0);
              }
              lVar22 = lVar22 + 0x10;
              uVar18 = uVar18 + lVar8;
              sVar20 = sVar20 + -1;
              uVar21 = uVar7;
            } while (sVar20 != 0);
            do {
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
            secp256k1_gej_set_infinity(&local_c8);
            psVar13 = r_00 + uVar11 + 1;
            lVar22 = uVar11 + 2;
            do {
              secp256k1_gej_add_var(&local_c8,&local_c8,psVar13,(secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,&local_c8,(secp256k1_fe *)0x0);
              lVar22 = lVar22 + -1;
              psVar13 = psVar13 + -1;
            } while (1 < lVar22);
            secp256k1_gej_add_var(&local_c8,&local_c8,r_00,(secp256k1_fe *)0x0);
            secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            secp256k1_gej_add_var(r,r,&local_c8,(secp256k1_fe *)0x0);
            uVar19 = uVar19 - 4;
            bVar2 = 0 < local_130;
            psVar13 = r_00;
            lVar22 = lVar16;
            local_130 = local_130 + -1;
          } while (bVar2);
          iVar12 = 1;
        }
      }
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  }
  return iVar12;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}